

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

uint64_t uv__get_cgroup1_current_memory(char *buf)

{
  uint64_t uVar1;
  uint local_103c;
  char *pcStack_1038;
  int n;
  char *p;
  uint64_t current;
  char filename [4097];
  char *buf_local;
  
  pcStack_1038 = uv__cgroup1_find_memory_controller(buf,(int *)&local_103c);
  if (pcStack_1038 != (char *)0x0) {
    snprintf((char *)&current,0x1001,"/sys/fs/cgroup/memory/%.*s/memory.usage_in_bytes",
             (ulong)local_103c,pcStack_1038);
    uVar1 = uv__read_uint64((char *)&current);
    if (uVar1 != 0) {
      return uVar1;
    }
    p = (char *)0x0;
  }
  uVar1 = uv__read_uint64("/sys/fs/cgroup/memory/memory.usage_in_bytes");
  return uVar1;
}

Assistant:

static uint64_t uv__get_cgroup1_current_memory(char buf[static 1024]) {
  char filename[4097];
  uint64_t current;
  char* p;
  int n;

  /* Find out where the controller is mounted. */
  p = uv__cgroup1_find_memory_controller(buf, &n);
  if (p != NULL) {
    snprintf(filename, sizeof(filename),
            "/sys/fs/cgroup/memory/%.*s/memory.usage_in_bytes", n, p);
    current = uv__read_uint64(filename);

    /* If the controller wasn't mounted, the reads above will have failed,
     * as indicated by uv__read_uint64 returning 0.
     */
    if (current != 0)
      return current;
  }

  /* Fall back to the usage of the global memory controller. */
  return uv__read_uint64("/sys/fs/cgroup/memory/memory.usage_in_bytes");
}